

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O3

float __thiscall
ltc::evaluate(ltc *this,vec3 *light_dir,vec3 *view_dir,float *probability_density_function)

{
  ostream *poVar1;
  logic_error *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_48;
  float fStack_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  
  get_framed_ltc_matrix_inv((mat3 *)&local_48.field_0,this);
  fVar5 = (light_dir->field_0).field_0.x;
  fVar2 = (light_dir->field_0).field_0.y;
  fVar3 = (light_dir->field_0).field_0.z;
  fVar6 = local_2c * fVar3 + local_48.field_0.y * fVar5 + local_38 * fVar2;
  fVar4 = fVar3 * local_30 + fVar5 * local_48.field_0.x + fStack_3c * fVar2;
  fVar5 = fVar3 * local_28 + fVar5 * local_48.field_0.z + local_34 * fVar2;
  fVar2 = 1.0 / SQRT(fVar5 * fVar5 + fVar6 * fVar6 + fVar4 * fVar4);
  fVar4 = fVar4 * fVar2;
  fVar6 = fVar6 * fVar2;
  fVar5 = fVar5 * fVar2;
  get_framed_ltc_matrix(this);
  fVar2 = local_2c * fVar5 + local_48.field_0.y * fVar4 + local_38 * fVar6;
  fVar3 = fVar5 * local_30 + fVar4 * local_48.field_0.x + fVar6 * fStack_3c;
  fVar4 = fVar5 * local_28 + fVar4 * local_48.field_0.z + fVar6 * local_34;
  fVar2 = SQRT(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
  if (fVar2 < 1e-08) {
    poVar1 = log_error();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               "Transformed light direction to original space is degenerated (with length = 0).",
               0x4f);
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Transformed light direction is degenerated");
  }
  else {
    get_framed_ltc_matrix(this);
    fVar2 = ((local_48.field_0.y * local_34 - local_48.field_0.z * local_38) * local_30 +
            ((local_38 * local_28 - local_34 * local_2c) * local_48.field_0.x -
            (local_28 * local_48.field_0.y - local_2c * local_48.field_0.z) * fStack_3c)) /
            (fVar2 * fVar2 * fVar2);
    if (!NAN(fVar2)) {
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      fVar2 = (fVar5 / 3.1415927) / fVar2;
      fVar5 = this->_amplitude;
      *probability_density_function = fVar2;
      return fVar5 * fVar2;
    }
    poVar1 = log_error();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"LTC Jacobian is NaN. Aborting.",0x1e)
    ;
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Jacobian is NaN");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

float ltc::evaluate(
  const glm::vec3 &light_dir,
  const glm::vec3 &view_dir,
  float &probability_density_function
) const
{
  // here 'original' means original clamped cosine distribution 'space'
  glm::vec3 original_light_dir = glm::normalize(get_framed_ltc_matrix_inv() * light_dir);
  auto len = glm::length(get_framed_ltc_matrix() * original_light_dir);

  const float MIN_TRANSFORMED_LENGTH = 0.00000001f;
  if (len < MIN_TRANSFORMED_LENGTH)
  {
    log_error() << "Transformed light direction to original space is degenerated (with length = 0)." << std::endl;
    throw std::logic_error("Transformed light direction is degenerated");
  }

  auto jacobian = glm::determinant(get_framed_ltc_matrix()) / (len * len * len);

  if (std::isnan(jacobian))
  {
    log_error() << "LTC Jacobian is NaN. Aborting." << std::endl;
    throw std::logic_error("Jacobian is NaN");
  }

  float d = std::max(0.0f, original_light_dir.z) / pi / jacobian;
  float result = _amplitude * d;

  probability_density_function = d;

  return result;
}